

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6258.c
# Opt level: O0

UINT8 device_start_okim6258(OKIM6258_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT32 sampleRate;
  okim6258_state *info_00;
  okim6258_state *info;
  DEV_INFO *retDevInf_local;
  OKIM6258_CFG *cfg_local;
  
  info_00 = (okim6258_state *)calloc(1,0x68);
  if (info_00 == (okim6258_state *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    info_00->initial_clock = (cfg->_genCfg).clock;
    info_00->start_divider = cfg->divider & 3;
    info_00->adpcm_type = cfg->adpcmBits;
    if (info_00->adpcm_type == '\0') {
      info_00->adpcm_type = '\x04';
    }
    compute_tables();
    info_00->master_clock = info_00->initial_clock;
    WriteLE32(info_00->clock_buffer,info_00->master_clock);
    info_00->divider = dividers[info_00->start_divider];
    info_00->SmpRateFunc = (DEVCB_SRATE_CHG)0x0;
    info_00->output_bits = cfg->outputBits;
    if (info_00->output_bits == '\0') {
      info_00->output_bits = '\n';
    }
    info_00->output_mask = (short)(1 << (0xc - info_00->output_bits & 0x1f)) - 1U ^ 0xffff;
    info_00->signal = -2;
    info_00->step = 0;
    okim6258_set_mute_mask(info_00,0);
    info_00->_devData = (DEV_DATA)info_00;
    sampleRate = get_vclk(info_00);
    INIT_DEVINF(retDevInf,(DEV_DATA *)info_00,sampleRate,&devDef);
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_okim6258(const OKIM6258_CFG* cfg, DEV_INFO* retDevInf)
{
	okim6258_state *info;

	info = (okim6258_state *)calloc(1, sizeof(okim6258_state));
	if (info == NULL)
		return 0xFF;

	info->initial_clock = cfg->_genCfg.clock;
	info->start_divider = cfg->divider & 0x03;
	info->adpcm_type = cfg->adpcmBits;
	if (! info->adpcm_type)
		info->adpcm_type = 4;

	compute_tables();

	info->master_clock = info->initial_clock;
	WriteLE32(info->clock_buffer, info->master_clock);
	info->divider = dividers[info->start_divider];
	info->SmpRateFunc = NULL;

	info->output_bits = cfg->outputBits;
	if (! info->output_bits)
		info->output_bits = 10;
	// D/A precision is 10-bits but 12-bit data can be output serially to an external DAC
	info->output_mask = ~((1 << (12 - info->output_bits)) - 1);

	info->signal = -2;
	info->step = 0;

	okim6258_set_mute_mask(info, 0x00);

	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, get_vclk(info), &devDef);
	return 0x00;
}